

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

Quaternion * __thiscall COLLADABU::Math::Quaternion::unitInverse(Quaternion *this)

{
  Real *in_RSI;
  Quaternion *in_RDI;
  
  Quaternion(in_RDI,*in_RSI,-in_RSI[1],-in_RSI[2],-in_RSI[3]);
  return in_RDI;
}

Assistant:

Quaternion Quaternion::unitInverse () const
        {
            // assert:  'this' is unit length
            return Quaternion( w, -x, -y, -z );
        }